

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

int __thiscall luna::Lexer::LexId(Lexer *this,TokenDetail *detail)

{
  string *str;
  char *__s2;
  char *__s1;
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  String *pSVar4;
  LexException *this_00;
  ulong uVar5;
  undefined8 *puVar6;
  anon_union_16_2_eed97686_for_String_2 *module;
  ulong uVar7;
  undefined1 *puVar8;
  difference_type __d;
  ulong uVar9;
  
  iVar2 = this->current_;
  iVar1 = isalpha(iVar2);
  if ((iVar2 != 0x5f) && (iVar1 == 0)) {
    this_00 = (LexException *)__cxa_allocate_exception(0x20);
    pSVar4 = this->module_;
    if ((pSVar4->super_GCObject).field_0x11 == '\0') {
      module = &pSVar4->field_1;
    }
    else {
      module = (anon_union_16_2_eed97686_for_String_2 *)(pSVar4->field_1).str_;
    }
    LexException::LexException<char_const(&)[19]>
              (this_00,module->str_buffer_,this->line_,this->column_,
               (char (*) [19])"unexpect character");
    __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
  }
  str = &this->token_buffer_;
  (this->token_buffer_)._M_string_length = 0;
  *(this->token_buffer_)._M_dataplus._M_p = '\0';
  do {
    do {
      std::__cxx11::string::push_back((char)str);
      iVar2 = Next(this);
      this->current_ = iVar2;
      iVar1 = isalnum(iVar2);
    } while (iVar2 == 0x5f);
  } while (iVar1 != 0);
  __s2 = (str->_M_dataplus)._M_p;
  puVar8 = (anonymous_namespace)::keyword;
  uVar5 = 0x15;
  do {
    uVar9 = uVar5 >> 1;
    puVar6 = (undefined8 *)((long)puVar8 + uVar9 * 8);
    __s1 = (char *)*puVar6;
    iVar2 = strcmp(__s1,__s2);
    if (iVar2 < 0) {
      puVar8 = (undefined1 *)(puVar6 + 1);
      uVar9 = ~uVar9 + uVar5;
    }
    else {
      iVar2 = strcmp(__s2,__s1);
      if (-1 < iVar2) {
        puVar3 = (undefined8 *)puVar8;
        if (1 < uVar5) {
          do {
            uVar7 = uVar9 >> 1;
            iVar2 = strcmp((char *)puVar3[uVar7],__s2);
            if (iVar2 < 0) {
              puVar3 = puVar3 + uVar7 + 1;
              uVar7 = ~uVar7 + uVar9;
            }
            uVar9 = uVar7;
          } while (0 < (long)uVar7);
        }
        puVar6 = puVar6 + 1;
        uVar5 = (long)((long)puVar8 + (uVar5 * 8 - (long)puVar6)) >> 3;
        while (uVar9 = uVar5, 0 < (long)uVar9) {
          uVar5 = uVar9 >> 1;
          iVar2 = strcmp(__s2,(char *)puVar6[uVar5]);
          if (-1 < iVar2) {
            puVar6 = puVar6 + uVar5 + 1;
            uVar5 = ~uVar5 + uVar9;
          }
        }
        if (puVar3 == puVar6) {
LAB_0013b7da:
          iVar2 = 0x115;
        }
        else {
          iVar2 = (int)((ulong)(puVar3 + -0x2aa96) >> 3) + 0x100;
        }
        pSVar4 = State::GetString(this->state_,str);
        (detail->field_0).str_ = pSVar4;
        detail->token_ = iVar2;
        iVar1 = this->column_;
        detail->line_ = this->line_;
        detail->column_ = iVar1;
        detail->module_ = this->module_;
        return iVar2;
      }
    }
    uVar5 = uVar9;
    if ((long)uVar9 < 1) goto LAB_0013b7da;
  } while( true );
}

Assistant:

int Lexer::LexId(TokenDetail *detail)
    {
        if (!isalpha(current_) && current_ != '_')
            throw LexException(module_->GetCStr(),
                    line_, column_, "unexpect character");

        token_buffer_.clear();
        token_buffer_.push_back(current_);
        current_ = Next();

        while (isalnum(current_) || current_ == '_')
        {
            token_buffer_.push_back(current_);
            current_ = Next();
        }

        int token = 0;
        if (!IsKeyWord(token_buffer_, &token))
            token = Token_Id;
        RETURN_TOKEN_DETAIL(detail, token_buffer_, token);
    }